

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O0

double __thiscall uttt::EvalMcts::operator()(EvalMcts *this,IBoard *board)

{
  IPlayer IVar1;
  bool bVar2;
  IBoard *in_RSI;
  double dVar3;
  MCTSResults *result;
  iterator __end1;
  iterator __begin1;
  vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *__range1;
  double max;
  vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> results;
  int status;
  longlong in_stack_000000c0;
  IBoard *in_stack_000000c8;
  vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *in_stack_ffffffffffffff78;
  __normal_iterator<mcts::MCTSResults_*,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
  *in_stack_ffffffffffffff80;
  vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *in_stack_ffffffffffffff90;
  double local_68;
  reference local_60;
  MCTSResults *local_58;
  __normal_iterator<mcts::MCTSResults_*,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
  local_50;
  undefined1 *local_48;
  MCTSResults *local_40;
  undefined1 local_38 [28];
  int local_1c;
  IBoard *local_18;
  MCTSResults *local_8;
  
  local_18 = in_RSI;
  local_1c = IBoard::GetStatus(in_RSI);
  if (local_1c == 0) {
    local_8 = (MCTSResults *)0x0;
  }
  else if (local_1c == -1) {
    mcts::MCTS_parallel<uttt::IBoard,mcts::RandomPlayout<uttt::IBoard>>
              (in_stack_000000c8,in_stack_000000c0);
    local_40 = (MCTSResults *)0xbff199999999999a;
    local_48 = local_38;
    local_50._M_current =
         (MCTSResults *)
         std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>::begin
                   (in_stack_ffffffffffffff78);
    local_58 = (MCTSResults *)
               std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>::end
                         (in_stack_ffffffffffffff78);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (in_stack_ffffffffffffff80,
                         (__normal_iterator<mcts::MCTSResults_*,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
                          *)in_stack_ffffffffffffff78);
      if (!bVar2) break;
      local_60 = __gnu_cxx::
                 __normal_iterator<mcts::MCTSResults_*,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
                 ::operator*(&local_50);
      local_68 = local_60->value / (double)local_60->total;
      in_stack_ffffffffffffff80 =
           (__normal_iterator<mcts::MCTSResults_*,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
            *)std::max<double>((double *)&local_40,&local_68);
      local_40 = in_stack_ffffffffffffff80->_M_current;
      __gnu_cxx::
      __normal_iterator<mcts::MCTSResults_*,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
      ::operator++(&local_50);
    }
    local_8 = local_40;
    std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>::~vector
              (in_stack_ffffffffffffff90);
  }
  else {
    IVar1 = IBoard::GetPlayerToMove(local_18);
    if (IVar1 == local_1c) {
      local_8 = (MCTSResults *)std::numeric_limits<double>::max();
    }
    else {
      dVar3 = std::numeric_limits<double>::max();
      local_8 = (MCTSResults *)((ulong)dVar3 ^ 0x8000000000000000);
    }
  }
  return (double)local_8;
}

Assistant:

double
EvalMcts::operator()(const IBoard &board) const
{
    int status = board.GetStatus();
    if (status == game::Draw)
        return 0.0;
    if (status != game::Undecided)
    {
        if (board.GetPlayerToMove() == status)
            return std::numeric_limits<double>::max();
        return -std::numeric_limits<double>::max();
    }
    auto results = mcts::MCTS_parallel<IBoard>(board, 100);
    double max = -1.1;
    for (const auto &result : results)
        max = std::max(max, result.value / result.total);
    return max;
}